

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void * __thiscall
google::protobuf::Reflection::MutableRawRepeatedField
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpptype,int ctype,
          Descriptor *desc)

{
  bool bVar1;
  CppType CVar2;
  int number;
  Type TVar3;
  Descriptor *pDVar4;
  Descriptor **v1;
  Descriptor **v2;
  char *failure_msg;
  LogMessage *pLVar5;
  ExtensionSet *this_00;
  MapFieldBase *this_01;
  LogMessage local_60;
  Voidify local_49;
  Descriptor *local_48;
  Nullable<const_char_*> local_40;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Descriptor *desc_local;
  int ctype_local;
  CppType cpptype_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)desc;
  desc_local._0_4_ = ctype;
  desc_local._4_4_ = cpptype;
  _ctype_local = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  bVar1 = FieldDescriptor::is_repeated(field);
  if (!bVar1) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,_ctype_local,"\"MutableRawRepeatedField\"",
               "Field is singular; the method requires a repeated field.");
  }
  pDVar4 = FieldDescriptor::containing_type(_ctype_local);
  if (pDVar4 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,_ctype_local,"MutableRawRepeatedField",
               "Field does not match message type.");
  }
  CVar2 = FieldDescriptor::cpp_type(_ctype_local);
  if (CVar2 != desc_local._4_4_) {
    CVar2 = FieldDescriptor::cpp_type(_ctype_local);
    if ((CVar2 != CPPTYPE_ENUM) || (desc_local._4_4_ != CPPTYPE_INT32)) {
      anon_unknown_6::ReportReflectionUsageTypeError
                (this->descriptor_,_ctype_local,"MutableRawRepeatedField",desc_local._4_4_);
    }
  }
  if (absl_log_internal_check_op_result != (Nullable<const_char_*>)0x0) {
    local_48 = FieldDescriptor::message_type(_ctype_local);
    v1 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::Descriptor_const*>(&local_48);
    v2 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::Descriptor_const*>
                   ((Descriptor **)&absl_log_internal_check_op_result);
    local_40 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*>
                         (v1,v2,"field->message_type() == desc");
    if (local_40 != (Nullable<const_char_*>)0x0) {
      failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_40);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0xac7,failure_msg);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar5,(char (*) [22])"wrong submessage type");
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar5);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_60);
    }
    local_40 = (Nullable<const_char_*>)0x0;
  }
  bVar1 = FieldDescriptor::is_extension(_ctype_local);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,(Message *)field_local);
    number = FieldDescriptor::number(_ctype_local);
    TVar3 = FieldDescriptor::type(_ctype_local);
    bVar1 = FieldDescriptor::is_packed(_ctype_local);
    this_local = (Reflection *)
                 internal::ExtensionSet::MutableRawRepeatedField
                           (this_00,number,(FieldType)TVar3,bVar1,_ctype_local);
  }
  else {
    bVar1 = anon_unknown_6::IsMapFieldInApi(_ctype_local);
    if (bVar1) {
      this_01 = MutableRawNonOneof<google::protobuf::internal::MapFieldBase>
                          (this,(Message *)field_local,_ctype_local);
      this_local = (Reflection *)internal::MapFieldBase::MutableRepeatedField(this_01);
    }
    else {
      this_local = (Reflection *)MutableRawNonOneof<void>(this,(Message *)field_local,_ctype_local);
    }
  }
  return this_local;
}

Assistant:

void* Reflection::MutableRawRepeatedField(Message* message,
                                          const FieldDescriptor* field,
                                          FieldDescriptor::CppType cpptype,
                                          int ctype,
                                          const Descriptor* desc) const {
  (void)ctype;  // Parameter is used by Google-internal code.
  USAGE_CHECK_REPEATED("MutableRawRepeatedField");
  USAGE_CHECK_MESSAGE_TYPE(MutableRawRepeatedField);

  if (field->cpp_type() != cpptype &&
      (field->cpp_type() != FieldDescriptor::CPPTYPE_ENUM ||
       cpptype != FieldDescriptor::CPPTYPE_INT32))
    ReportReflectionUsageTypeError(descriptor_, field,
                                   "MutableRawRepeatedField", cpptype);
  if (desc != nullptr)
    ABSL_CHECK_EQ(field->message_type(), desc) << "wrong submessage type";
  if (field->is_extension()) {
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number(), field->type(), field->is_packed(), field);
  } else {
    // Trigger transform for MapField
    if (IsMapFieldInApi(field)) {
      return MutableRawNonOneof<MapFieldBase>(message, field)
          ->MutableRepeatedField();
    }
    return MutableRawNonOneof<void>(message, field);
  }
}